

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3IncrmergeChomp(Fts3Table *p,sqlite3_int64 iAbsLevel,Fts3MultiSegReader *pCsr,int *pnRem)

{
  int nTerm;
  char *zTerm;
  Fts3SegReader *pFStack_40;
  int j;
  Fts3SegReader *pSeg;
  int local_30;
  int rc;
  int nRem;
  int i;
  int *pnRem_local;
  Fts3MultiSegReader *pCsr_local;
  sqlite3_int64 iAbsLevel_local;
  Fts3Table *p_local;
  
  local_30 = 0;
  pSeg._4_4_ = 0;
  rc = pCsr->nSegment;
  while (rc = rc + -1, -1 < rc && pSeg._4_4_ == 0) {
    pFStack_40 = (Fts3SegReader *)0x0;
    zTerm._4_4_ = 0;
    while ((zTerm._4_4_ < pCsr->nSegment &&
           (pFStack_40 = pCsr->apSegment[zTerm._4_4_], pFStack_40->iIdx != rc))) {
      zTerm._4_4_ = zTerm._4_4_ + 1;
    }
    if (pFStack_40->aNode == (char *)0x0) {
      pSeg._4_4_ = fts3DeleteSegment(p,pFStack_40);
      if (pSeg._4_4_ == 0) {
        pSeg._4_4_ = fts3RemoveSegdirEntry(p,iAbsLevel,pFStack_40->iIdx);
      }
      *pnRem = 0;
    }
    else {
      pSeg._4_4_ = fts3TruncateSegment(p,iAbsLevel,pFStack_40->iIdx,pFStack_40->zTerm,
                                       pFStack_40->nTerm);
      local_30 = local_30 + 1;
    }
  }
  if ((pSeg._4_4_ == 0) && (local_30 != pCsr->nSegment)) {
    pSeg._4_4_ = fts3RepackSegdirLevel(p,iAbsLevel);
  }
  *pnRem = local_30;
  return pSeg._4_4_;
}

Assistant:

static int fts3IncrmergeChomp(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level containing segments */
  Fts3MultiSegReader *pCsr,       /* Chomp all segments opened by this cursor */
  int *pnRem                      /* Number of segments not deleted */
){
  int i;
  int nRem = 0;
  int rc = SQLITE_OK;

  for(i=pCsr->nSegment-1; i>=0 && rc==SQLITE_OK; i--){
    Fts3SegReader *pSeg = 0;
    int j;

    /* Find the Fts3SegReader object with Fts3SegReader.iIdx==i. It is hiding
    ** somewhere in the pCsr->apSegment[] array.  */
    for(j=0; ALWAYS(j<pCsr->nSegment); j++){
      pSeg = pCsr->apSegment[j];
      if( pSeg->iIdx==i ) break;
    }
    assert( j<pCsr->nSegment && pSeg->iIdx==i );

    if( pSeg->aNode==0 ){
      /* Seg-reader is at EOF. Remove the entire input segment. */
      rc = fts3DeleteSegment(p, pSeg);
      if( rc==SQLITE_OK ){
        rc = fts3RemoveSegdirEntry(p, iAbsLevel, pSeg->iIdx);
      }
      *pnRem = 0;
    }else{
      /* The incremental merge did not copy all the data from this 
      ** segment to the upper level. The segment is modified in place
      ** so that it contains no keys smaller than zTerm/nTerm. */ 
      const char *zTerm = pSeg->zTerm;
      int nTerm = pSeg->nTerm;
      rc = fts3TruncateSegment(p, iAbsLevel, pSeg->iIdx, zTerm, nTerm);
      nRem++;
    }
  }

  if( rc==SQLITE_OK && nRem!=pCsr->nSegment ){
    rc = fts3RepackSegdirLevel(p, iAbsLevel);
  }

  *pnRem = nRem;
  return rc;
}